

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O3

Config * __thiscall QPDFJob::Config::showObject(Config *this,string *parameter)

{
  element_type *peVar1;
  
  peVar1 = (this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  parse_object_id(parameter,&peVar1->show_trailer,&peVar1->show_obj,&peVar1->show_gen);
  ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  require_outfile = false;
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::showObject(std::string const& parameter)
{
    QPDFJob::parse_object_id(parameter, o.m->show_trailer, o.m->show_obj, o.m->show_gen);
    o.m->require_outfile = false;
    return this;
}